

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

BOOL InitializeCriticalSectionEx(LPCRITICAL_SECTION lpCriticalSection,DWORD dwSpinCount,DWORD Flags)

{
  DWORD Flags_local;
  DWORD dwSpinCount_local;
  LPCRITICAL_SECTION lpCriticalSection_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  CorUnix::InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection,dwSpinCount,false);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return 1;
}

Assistant:

BOOL InitializeCriticalSectionEx(LPCRITICAL_SECTION lpCriticalSection, DWORD dwSpinCount, DWORD Flags)
{
    PERF_ENTRY(InitializeCriticalSection);
    ENTRY("InitializeCriticalSectionEx(lpCriticalSection=%p, dwSpinCount=%d, Flags=%d)\n",
          lpCriticalSection, dwSpinCount, Flags);

    InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection, dwSpinCount, false);

    LOGEXIT("InitializeCriticalSectionEx returns TRUE\n");
    PERF_EXIT(InitializeCriticalSection);
    return true;
}